

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O3

void __thiscall
xe::ContainerFormatParser::parseContainerValue(ContainerFormatParser *this,string *dst,int *offset)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  
  iVar3 = *offset;
  bVar2 = false;
  bVar4 = 0;
  if ((iVar3 < (this->m_buf).m_numElements) &&
     ((bVar1 = (this->m_buf).m_buffer[((this->m_buf).m_back + iVar3) % (this->m_buf).m_size],
      bVar1 == 0x27 || (bVar4 = 0, bVar1 == 0x22)))) {
    *offset = iVar3 + 1;
    bVar2 = true;
    bVar4 = bVar1;
  }
  dst->_M_string_length = 0;
  *(dst->_M_dataplus)._M_p = '\0';
  iVar3 = *offset;
  iVar5 = (this->m_buf).m_numElements;
  if (iVar3 < iVar5 && iVar3 < this->m_elementLen) {
    while( true ) {
      bVar1 = (this->m_buf).m_buffer[((this->m_buf).m_back + iVar3) % (this->m_buf).m_size];
      if (bVar1 == 0) break;
      if (bVar2) {
        if (bVar4 == bVar1) goto LAB_00115b0d;
      }
      else if ((bVar1 < 0x21) && ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        return;
      }
      std::__cxx11::string::push_back((char)dst);
      iVar3 = *offset + 1;
      *offset = iVar3;
      iVar5 = (this->m_buf).m_numElements;
      if ((this->m_elementLen <= iVar3) || (iVar5 <= iVar3)) break;
    }
  }
  if (bVar2) {
LAB_00115b0d:
    if ((iVar3 < iVar5) &&
       (bVar4 == (this->m_buf).m_buffer[((this->m_buf).m_back + iVar3) % (this->m_buf).m_size])) {
      *offset = iVar3 + 1;
    }
  }
  return;
}

Assistant:

void ContainerFormatParser::parseContainerValue (std::string& dst, int& offset) const
{
	DE_ASSERT(offset < m_elementLen);

	bool	isString	= getChar(offset) == '"' || getChar(offset) == '\'';
	int		quotChar	= isString ? getChar(offset) : 0;

	if (isString)
		offset += 1;

	dst.clear();

	for (;;)
	{
		int		curChar		= offset < m_elementLen ? getChar(offset) : 0;
		bool	isEnd		= curChar == 0 || curChar == (int)END_OF_BUFFER ||
							  (isString ? (curChar == quotChar) : (curChar == ' ' || curChar == '\n' || curChar == '\r'));

		if (isEnd)
			break;
		else
		{
			// \todo [2012-06-09 pyry] Escapes.
			dst.push_back((char)curChar);
		}

		offset += 1;
	}

	if (isString && getChar(offset) == quotChar)
		offset += 1;
}